

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

qreal __thiscall QGraphicsItem::boundingRegionGranularity(QGraphicsItem *this)

{
  QGraphicsItemPrivate *pQVar1;
  ulong uVar2;
  ExtraStruct *pEVar3;
  bool bVar4;
  QMetaType QVar5;
  anon_union_24_3_e3d07ef4_for_data *paVar6;
  ExtraStruct *pEVar7;
  ulong uVar8;
  uint uVar9;
  long in_FS_OFFSET;
  undefined4 uVar10;
  undefined4 uVar11;
  double t;
  QMetaType local_58;
  QMetaType local_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  ulong local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d;
  uVar10 = 0;
  uVar11 = 0;
  uVar9 = (uint)*(undefined8 *)&pQVar1->field_0x160;
  if ((uVar9 >> 0x17 & 1) == 0) goto LAB_005ed592;
  uVar2 = (pQVar1->extras).d.size;
  if (uVar2 == 0) {
LAB_005ed4e9:
    local_48.shared = (PrivateShared *)0x0;
    local_48._8_8_ = 0;
    local_48._16_8_ = 0;
    local_30 = 2;
  }
  else {
    pEVar7 = (pQVar1->extras).d.ptr;
    if (pEVar7->type == ExtraBoundingRegionGranularity) {
      ::QVariant::QVariant((QVariant *)&local_48,&pEVar7->value);
    }
    else {
      uVar8 = 0;
      do {
        pEVar3 = pEVar7;
        pEVar7 = pEVar3 + 1;
        if (uVar2 - 1 == uVar8) goto LAB_005ed4e9;
        uVar8 = uVar8 + 1;
      } while (pEVar7->type != ExtraBoundingRegionGranularity);
      ::QVariant::QVariant((QVariant *)&local_48,&pEVar3[1].value);
      if (uVar2 <= uVar8) goto LAB_005ed4e9;
    }
  }
  local_50.d_ptr = (QMetaTypeInterface *)&QtPrivate::QMetaTypeInterfaceWrapper<double>::metaType;
  local_58.d_ptr = (QMetaTypeInterface *)(local_30 & 0xfffffffffffffffc);
  bVar4 = comparesEqual(&local_58,&local_50);
  if (bVar4) {
    if ((local_30 & 1) == 0) {
      uVar10 = SUB84(local_48.shared,0);
      uVar11 = (undefined4)((ulong)local_48._0_8_ >> 0x20);
    }
    else {
      uVar10 = (undefined4)*(undefined8 *)(local_48.shared + *(int *)(local_48.shared + 4));
      uVar11 = (undefined4)
               ((ulong)*(undefined8 *)(local_48.shared + *(int *)(local_48.shared + 4)) >> 0x20);
    }
  }
  else {
    local_58.d_ptr = (QMetaTypeInterface *)0x0;
    paVar6 = &local_48;
    QVar5.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
    if ((local_30 & 1) != 0) {
      paVar6 = (anon_union_24_3_e3d07ef4_for_data *)
               (local_48.shared + *(int *)(local_48.shared + 4));
    }
    QMetaType::convert(QVar5,paVar6,local_50,&local_58);
    uVar10 = SUB84(local_58.d_ptr,0);
    uVar11 = (undefined4)((ulong)local_58.d_ptr >> 0x20);
  }
LAB_005ed592:
  if ((uVar9 >> 0x17 & 1) != 0) {
    ::QVariant::~QVariant((QVariant *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (qreal)CONCAT44(uVar11,uVar10);
  }
  __stack_chk_fail();
}

Assistant:

qreal QGraphicsItem::boundingRegionGranularity() const
{
    return d_ptr->hasBoundingRegionGranularity
        ? qvariant_cast<qreal>(d_ptr->extra(QGraphicsItemPrivate::ExtraBoundingRegionGranularity))
        : 0;
}